

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-extra-test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_3ac2::OutputRedirectTest_RestoreAndRead_Test::TestBody
          (OutputRedirectTest_RestoreAndRead_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  char *pcVar3;
  int __fd;
  buffered_file file;
  file write_end;
  file read_end;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_2;
  OutputRedirect redir;
  buffered_file local_88;
  file local_80;
  file local_7c;
  string local_78;
  AssertHelper local_58;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  string local_48;
  OutputRedirect local_28;
  
  local_7c.fd_ = -1;
  local_80.fd_ = -1;
  fmt::v5::file::pipe(&local_7c,&local_80.fd_);
  fmt::v5::file::fdopen((file *)&local_88,(int)&local_80,"w");
  fwrite("[[[",3,1,(FILE *)local_88.file_);
  OutputRedirect::OutputRedirect(&local_28,local_88.file_);
  fwrite("censored",8,1,(FILE *)local_88.file_);
  OutputRedirect::restore_and_read_abi_cxx11_(&local_48,&local_28);
  sanitize(&local_78,
           (anon_unknown_dwarf_3ac2 *)
           CONCAT71(local_48._M_dataplus._M_p._1_7_,(char)local_48._M_dataplus._M_p),
           (string *)local_48._M_string_length);
  testing::internal::CmpHelperEQ<char[9],std::__cxx11::string>
            ((internal *)&local_58,"\"censored\"","sanitize(redir.restore_and_read())",
             (char (*) [9])"censored",&local_78);
  paVar1 = &local_78.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_48._M_dataplus._M_p._1_7_,(char)local_48._M_dataplus._M_p) !=
      &local_48.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_48._M_dataplus._M_p._1_7_,(char)local_48._M_dataplus._M_p));
  }
  if (local_58.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_78);
    if (local_50.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_50.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/gtest-extra-test.cc"
               ,0x170,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if ((long *)local_78._M_dataplus._M_p != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)local_78._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_78._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  OutputRedirect::restore_and_read_abi_cxx11_(&local_48,&local_28);
  sanitize(&local_78,
           (anon_unknown_dwarf_3ac2 *)
           CONCAT71(local_48._M_dataplus._M_p._1_7_,(char)local_48._M_dataplus._M_p),
           (string *)local_48._M_string_length);
  pcVar3 = "";
  testing::internal::CmpHelperEQ<char[1],std::__cxx11::string>
            ((internal *)&local_58,"\"\"","sanitize(redir.restore_and_read())",
             (char (*) [1])0x164b13,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_48._M_dataplus._M_p._1_7_,(char)local_48._M_dataplus._M_p) !=
      &local_48.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_48._M_dataplus._M_p._1_7_,(char)local_48._M_dataplus._M_p));
  }
  if (local_58.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_78);
    if (local_50.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = ((local_50.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/gtest-extra-test.cc"
               ,0x171,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if ((long *)local_78._M_dataplus._M_p != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)local_78._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_78._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  __fd = 3;
  fwrite("]]]",3,1,(FILE *)local_88.file_);
  local_78._M_dataplus._M_p = (pointer)0x0;
  fmt::v5::buffered_file::close(&local_88,__fd);
  local_88.file_ = (FILE *)local_78._M_dataplus._M_p;
  local_78._M_dataplus._M_p = (pointer)0x0;
  fmt::v5::buffered_file::~buffered_file((buffered_file *)&local_78);
  read_abi_cxx11_((int)&local_78,&local_7c,6);
  testing::internal::CmpHelperEQ<char[7],std::__cxx11::string>
            ((internal *)&local_48,"\"[[[]]]\"","read(read_end, std::strlen(\"[[[]]]\"))",
             (char (*) [7])"[[[]]]",&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  if ((char)local_48._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_78);
    if ((string *)local_48._M_string_length == (string *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((_Alloc_hider *)local_48._M_string_length)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/gtest-extra-test.cc"
               ,0x174,pcVar3);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if ((long *)local_78._M_dataplus._M_p != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)local_78._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_78._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_48._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  OutputRedirect::~OutputRedirect(&local_28);
  fmt::v5::buffered_file::~buffered_file(&local_88);
  fmt::v5::file::~file(&local_80);
  fmt::v5::file::~file(&local_7c);
  return;
}

Assistant:

TEST(OutputRedirectTest, RestoreAndRead) {
  file read_end, write_end;
  file::pipe(read_end, write_end);
  buffered_file file(write_end.fdopen("w"));
  std::fprintf(file.get(), "[[[");
  OutputRedirect redir(file.get());
  std::fprintf(file.get(), "censored");
  EXPECT_EQ("censored", sanitize(redir.restore_and_read()));
  EXPECT_EQ("", sanitize(redir.restore_and_read()));
  std::fprintf(file.get(), "]]]");
  file = buffered_file();
  EXPECT_READ(read_end, "[[[]]]");
}